

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::checkFramebufferStatus(Functions *gl)

{
  NotSupportedError *this;
  TestError *this_00;
  Enum<int,_2UL> EVar1;
  GetNameFunc local_a0;
  int local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  GLenum local_14;
  Functions *pFStack_10;
  deUint32 status;
  Functions *gl_local;
  
  pFStack_10 = gl;
  local_14 = (*gl->checkFramebufferStatus)(0x8d40);
  if (local_14 == 0x8cdd) {
    local_4d = 1;
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unsupported framebuffer configuration",&local_39);
    tcu::NotSupportedError::NotSupportedError(this,&local_38);
    local_4d = 0;
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  if (local_14 != 0x8cd5) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    EVar1 = glu::getFramebufferStatusStr(local_14);
    local_a0 = EVar1.m_getName;
    local_98 = EVar1.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_a0);
    std::operator+(&local_70,"Incomplete framebuffer: ",&local_90);
    tcu::TestError::TestError(this_00,&local_70);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

static void checkFramebufferStatus (const glw::Functions& gl)
{
	const deUint32 status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);

	if (status == GL_FRAMEBUFFER_UNSUPPORTED)
		throw tcu::NotSupportedError("Unsupported framebuffer configuration");
	else if (status != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::TestError("Incomplete framebuffer: " + glu::getFramebufferStatusStr(status).toString());
}